

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_initCStream_usingDict(ZSTD_CStream *zcs,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  size_t sVar2;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  sVar1 = ZSTD_CCtx_setParameter(zcs,ZSTD_c_compressionLevel,compressionLevel);
  if (sVar1 < 0xffffffffffffff89) {
    sVar2 = ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
    sVar1 = 0;
    if (0xffffffffffffff88 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_initCStream_usingDict(ZSTD_CStream* zcs, const void* dict, size_t dictSize, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    return 0;
}